

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_CommonExpr_Test::~ExprTest_CommonExpr_Test(ExprTest_CommonExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_CommonExpr_Test((ExprTest_CommonExpr_Test *)0x14a468);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, CommonExpr) {
  mp::Reference e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeCommonExpr(42);
  EXPECT_EQ(expr::COMMON_EXPR, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(42, e.index());
}